

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_validate.c
# Opt level: O2

int cfg_validate_int(autobuf *out,char *section_name,char *entry_name,char *value,int64_t min,
                    int64_t max,uint16_t bytelen,uint16_t fraction)

{
  long number;
  int iVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  uint64_t scaling;
  char *fmt;
  char *pcVar5;
  bool bVar6;
  int64_t i;
  int64_t local_70;
  long local_68;
  isonumber_str hbuf;
  
  uVar4 = (ulong)fraction;
  scaling = 1;
  uVar2 = uVar4;
  while (bVar6 = uVar2 != 0, uVar2 = uVar2 - 1, bVar6) {
    scaling = scaling * 10;
  }
  local_70 = max;
  local_68 = min;
  iVar1 = isonumber_to_s64(&i,value,scaling);
  number = local_68;
  if (iVar1 == 0) {
    bVar3 = (char)bytelen * -8;
    if ((long)(0x7fffffffffffffffU >> (bVar3 & 0x3f)) < i ||
        i < -0x8000000000000000 >> (bVar3 & 0x3f)) {
      pcVar5 = "large";
      if (i < local_68) {
        pcVar5 = "small";
      }
      cfg_append_printable_line
                (out,
                 "Value \'%s\' for entry \'%s\' in section %s is too %s for a %d-hyte integer with %d fractional digits"
                 ,value,entry_name,section_name,pcVar5,(ulong)bytelen,uVar4);
    }
    if (i < number) {
      pcVar5 = isonumber_from_s64(&hbuf,number,"",scaling,true);
      fmt = "Value \'%s\' for entry \'%s\' in section %s is smaller than %s";
    }
    else {
      if (i <= local_70) {
        return 0;
      }
      pcVar5 = isonumber_from_s64(&hbuf,number,"",scaling,true);
      fmt = "Value \'%s\' for entry \'%s\' in section %s is larger than %s";
    }
    cfg_append_printable_line(out,fmt,value,entry_name,section_name,pcVar5);
  }
  else if (fraction == 0) {
    cfg_append_printable_line
              (out,"Value \'%s\' for entry \'%s\' in section %s is not a %d-byte integer.",value,
               entry_name,section_name,(ulong)bytelen);
  }
  else {
    cfg_append_printable_line
              (out,
               "Value \'%s\' for entry \'%s\' in section %s is not a fractional %d-byte integer with a maximum of %d fractional digits"
               ,value,entry_name,section_name,(ulong)bytelen,uVar4);
  }
  return -1;
}

Assistant:

int
cfg_validate_int(struct autobuf *out, const char *section_name, const char *entry_name, const char *value, int64_t min,
  int64_t max, uint16_t bytelen, uint16_t fraction) {
  int64_t i, min64, max64;
  uint64_t j, scaling;
  struct isonumber_str hbuf;

  for (j = 0, scaling = 1; j < fraction; j++, scaling*=10);
  if (isonumber_to_s64(&i, value, scaling)) {
    if (fraction) {
      cfg_append_printable_line(out,
        "Value '%s' for entry '%s'"
        " in section %s is not a fractional %d-byte integer"
        " with a maximum of %d fractional digits",
        value, entry_name, section_name, bytelen, fraction);
    }
    else {
      cfg_append_printable_line(out,
        "Value '%s' for entry '%s'"
        " in section %s is not a %d-byte integer.",
        value, entry_name, section_name, bytelen);
    }
    return -1;
  }

  min64 = INT64_MIN >> (8 * (8 - bytelen));
  max64 = INT64_MAX >> (8 * (8 - bytelen));

  if (i < min64 || i > max64) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s' in section %s is "
      "too %s for a %d-hyte integer with %d fractional digits",
      value, entry_name, section_name, i < min ? "small" : "large", bytelen, fraction);
  }

  if (i < min) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s' in section %s is "
      "smaller than %s",
      value, entry_name, section_name, isonumber_from_s64(&hbuf, min, "", scaling, true));
    return -1;
  }
  if (i > max) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s' in section %s is "
      "larger than %s",
      value, entry_name, section_name, isonumber_from_s64(&hbuf, min, "", scaling, true));
    return -1;
  }
  return 0;
}